

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O1

void __thiscall L16_1::Report::~Report(Report *this)

{
  pointer pcVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Object deleted...\n",0x12);
  pcVar1 = (this->_str)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_str).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Report() {
            cout << "Object deleted...\n";
        }